

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

_Bool obj_can_refill(object *obj)

{
  _Bool _Var1;
  object *poVar2;
  object *light;
  object *obj_local;
  
  poVar2 = equipped_item_by_slot_name(player,"light");
  _Var1 = flag_has_dbg(obj->flags,5,0x15,"obj->flags","OF_NO_FUEL");
  if (_Var1) {
    return false;
  }
  if ((poVar2 != (object *)0x0) &&
     (_Var1 = flag_has_dbg(poVar2->flags,5,0x14,"light->flags","OF_TAKES_FUEL"), _Var1)) {
    _Var1 = tval_is_fuel(obj);
    if (_Var1) {
      return true;
    }
    _Var1 = tval_is_light(obj);
    if (((_Var1) && (_Var1 = flag_has_dbg(obj->flags,5,0x14,"obj->flags","OF_TAKES_FUEL"), _Var1))
       && (0 < obj->timeout)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool obj_can_refill(const struct object *obj)
{
	const struct object *light = equipped_item_by_slot_name(player, "light");

	/* Need fuel? */
	if (of_has(obj->flags, OF_NO_FUEL)) return false;

	/* A lantern can be refueled from a flask or another lantern */
	if (light && of_has(light->flags, OF_TAKES_FUEL)) {
		if (tval_is_fuel(obj))
			return true;
		else if (tval_is_light(obj) && of_has(obj->flags, OF_TAKES_FUEL) &&
				 obj->timeout > 0) 
			return true;
	}

	return false;
}